

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

url * __thiscall m2d::savanna::endpoint::url(url *__return_storage_ptr__,endpoint *this)

{
  string local_30;
  
  (*this->_vptr_endpoint[8])(&local_30);
  savanna::url::url(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

savanna::url url()
		{
			return savanna::url(build_url_str());
		}